

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_sse41_128_8.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_scan_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  byte *pbVar1;
  char *pcVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  int8_t iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  parasail_result_t *ppVar16;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int8_t *ptr_06;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  __m128i *palVar20;
  uint uVar21;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int32_t segNum;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  char cVar32;
  char cVar33;
  char cVar39;
  char cVar41;
  char cVar43;
  char cVar45;
  char cVar47;
  char cVar49;
  char cVar51;
  char cVar53;
  char cVar56;
  char cVar58;
  char cVar60;
  char cVar62;
  char cVar64;
  char cVar66;
  undefined1 auVar34 [16];
  char cVar40;
  char cVar42;
  char cVar44;
  char cVar46;
  char cVar48;
  char cVar50;
  char cVar52;
  char cVar54;
  char cVar57;
  char cVar59;
  char cVar61;
  char cVar63;
  char cVar65;
  char cVar67;
  char cVar68;
  char cVar69;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong uVar55;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ulong uVar86;
  byte bVar87;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  byte bVar107;
  undefined1 auVar92 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  char cVar115;
  byte bVar116;
  char cVar117;
  byte bVar118;
  char cVar119;
  byte bVar120;
  char cVar121;
  byte bVar122;
  char cVar123;
  byte bVar124;
  char cVar125;
  byte bVar126;
  char cVar127;
  byte bVar128;
  char cVar129;
  byte bVar130;
  char cVar131;
  byte bVar132;
  char cVar133;
  byte bVar134;
  char cVar135;
  byte bVar136;
  char cVar137;
  byte bVar138;
  char cVar139;
  byte bVar140;
  char cVar141;
  byte bVar142;
  char cVar143;
  byte bVar144;
  char cVar145;
  byte bVar146;
  undefined1 in_XMM11 [16];
  char cVar147;
  byte bVar148;
  char cVar150;
  byte bVar151;
  char cVar152;
  byte bVar153;
  char cVar154;
  byte bVar155;
  char cVar156;
  byte bVar157;
  char cVar158;
  byte bVar159;
  char cVar160;
  byte bVar161;
  char cVar162;
  byte bVar163;
  char cVar164;
  byte bVar165;
  char cVar166;
  byte bVar167;
  char cVar168;
  byte bVar169;
  char cVar170;
  byte bVar171;
  char cVar172;
  byte bVar173;
  char cVar174;
  byte bVar175;
  char cVar176;
  byte bVar177;
  undefined1 auVar149 [16];
  char cVar178;
  byte bVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_8_t h;
  int local_2b4;
  undefined1 local_288 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_238 [16];
  char local_1b8;
  char cStack_1b7;
  char cStack_1b6;
  char cStack_1b5;
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  char cStack_1b1;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  undefined1 local_1a8 [16];
  byte local_e8;
  byte bStack_e7;
  byte bStack_e6;
  byte bStack_e5;
  byte bStack_e4;
  byte bStack_e3;
  byte bStack_e2;
  byte bStack_e1;
  byte bStack_e0;
  byte bStack_df;
  byte bStack_de;
  byte bStack_dd;
  byte bStack_dc;
  byte bStack_db;
  byte bStack_da;
  byte bStack_d9;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_scan_profile_sse41_128_8_cold_8();
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_stats_scan_profile_sse41_128_8_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_scan_profile_sse41_128_8_cold_6();
      }
      else {
        uVar15 = profile->s1Len;
        if ((int)uVar15 < 1) {
          parasail_sg_flags_stats_scan_profile_sse41_128_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_scan_profile_sse41_128_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_scan_profile_sse41_128_8_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_scan_profile_sse41_128_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_scan_profile_sse41_128_8_cold_1();
        }
        else {
          iVar22 = uVar15 - 1;
          uVar31 = (ulong)uVar15 + 0xf >> 4;
          uVar30 = (uint)uVar31;
          iVar12 = iVar22 / (int)uVar30;
          uVar23 = iVar22 % (int)uVar30;
          pvVar5 = (profile->profile8).matches;
          pvVar6 = (profile->profile8).similar;
          iVar24 = -open;
          iVar25 = ppVar4->min;
          local_238._0_4_ = iVar24;
          uVar21 = (uint)(byte)-(char)iVar25;
          if (iVar25 != iVar24 && SBORROW4(iVar25,iVar24) == iVar25 + open < 0) {
            uVar21 = open;
          }
          iVar25 = ppVar4->max;
          ppVar16 = parasail_result_new_stats();
          if (ppVar16 != (parasail_result_t *)0x0) {
            ppVar16->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x10110402;
            b = parasail_memalign___m128i(0x10,uVar31);
            b_00 = parasail_memalign___m128i(0x10,uVar31);
            b_01 = parasail_memalign___m128i(0x10,uVar31);
            local_268._8_8_ = local_268._0_8_;
            local_268._0_8_ = CONCAT44(0,s2Len);
            b_02 = parasail_memalign___m128i(0x10,uVar31);
            ptr = parasail_memalign___m128i(0x10,uVar31);
            b_03 = parasail_memalign___m128i(0x10,uVar31);
            b_04 = parasail_memalign___m128i(0x10,uVar31);
            b_05 = parasail_memalign___m128i(0x10,uVar31);
            ptr_00 = parasail_memalign___m128i(0x10,uVar31);
            ptr_01 = parasail_memalign___m128i(0x10,uVar31);
            ptr_02 = parasail_memalign___m128i(0x10,uVar31);
            ptr_03 = parasail_memalign___m128i(0x10,uVar31);
            ptr_04 = parasail_memalign___m128i(0x10,uVar31);
            ptr_05 = parasail_memalign___m128i(0x10,uVar31);
            ptr_06 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_06 != (int8_t *)0x0 &&
                (ptr_05 != (__m128i *)0x0 && (ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0))
                ) && ((ptr_02 != (__m128i *)0x0 &&
                      (ptr_01 != (__m128i *)0x0 &&
                      (ptr_00 != (__m128i *)0x0 && b_05 != (__m128i *)0x0))) &&
                     ((b_04 != (__m128i *)0x0 && (b_03 != (__m128i *)0x0 && ptr != (__m128i *)0x0))
                     && ((b_02 != (__m128i *)0x0 && b_01 != (__m128i *)0x0) &&
                        (b_00 != (__m128i *)0x0 && b != (__m128i *)0x0))))) {
              iVar13 = s2Len + -1;
              uVar17 = 0xf - iVar12;
              auVar70 = pshufb(ZEXT416((uint)open),(undefined1  [16])0x0);
              auVar71 = pshufb(ZEXT416((uint)gap),(undefined1  [16])0x0);
              bVar10 = (char)uVar21 + 0x81;
              auVar82 = ZEXT116(bVar10);
              auVar72 = pshufb(auVar82,(undefined1  [16])0x0);
              auVar73 = pshufb(ZEXT116((byte)(0x7e - (char)iVar25)),(undefined1  [16])0x0);
              auVar74 = pshufb(ZEXT416(uVar17),(undefined1  [16])0x0);
              auVar34 = pmovzxbq((undefined1  [16])0x0,0x80);
              auVar75 = pshufb(ZEXT416(uVar30),auVar34);
              auVar34 = pshufb(ZEXT116((byte)-((char)uVar31 * (char)gap)),auVar34);
              auVar76 = paddsb(auVar34,auVar82);
              c[1]._0_4_ = gap;
              c[0] = uVar31;
              c[1]._4_4_ = 0;
              uVar27 = uVar31;
              parasail_memset___m128i(b_03,c,uVar31);
              c_00[1] = extraout_RDX;
              c_00[0] = uVar31;
              parasail_memset___m128i(b_04,c_00,uVar27);
              c_01[1] = extraout_RDX_00;
              c_01[0] = uVar31;
              parasail_memset___m128i(b_05,c_01,uVar27);
              c_02[1] = extraout_RDX_01;
              c_02[0] = uVar31;
              parasail_memset___m128i(b,c_02,uVar27);
              c_03[1] = extraout_RDX_02;
              c_03[0] = uVar31;
              parasail_memset___m128i(b_00,c_03,uVar27);
              c_04[1] = extraout_RDX_03;
              c_04[0] = uVar31;
              parasail_memset___m128i(b_01,c_04,uVar27);
              c_05[1] = extraout_RDX_04;
              c_05[0] = uVar31;
              parasail_memset___m128i(b_02,c_05,uVar27);
              auVar34 = _DAT_008d0c20;
              auVar83 = psubsb((undefined1  [16])0x0,auVar70);
              uVar18 = (ulong)(uVar30 - 1);
              lVar19 = uVar18 << 4;
              uVar27 = uVar31;
              auVar77 = _DAT_008d0c20;
              do {
                *(undefined1 (*) [16])((long)*ptr_04 + lVar19) = auVar83;
                *(undefined1 (*) [16])((long)*ptr_05 + lVar19) = auVar77;
                auVar83 = psubsb(auVar83,auVar71);
                auVar77 = paddsb(auVar77,auVar34);
                lVar19 = lVar19 + -0x10;
                iVar25 = (int)uVar27;
                uVar21 = iVar25 - 1;
                uVar27 = (ulong)uVar21;
              } while (uVar21 != 0 && 0 < iVar25);
              lVar19 = (long)iVar24;
              uVar27 = 0;
              do {
                lVar29 = 0;
                lVar26 = lVar19;
                do {
                  lVar28 = lVar26;
                  if (s1_beg != 0) {
                    lVar28 = 0;
                  }
                  if (lVar28 < -0x7f) {
                    lVar28 = -0x80;
                  }
                  *(char *)((long)&local_48 + lVar29) = (char)lVar28;
                  lVar29 = lVar29 + 1;
                  lVar26 = lVar26 - uVar31 * (uint)gap;
                } while (lVar29 != 0x10);
                ptr[uVar27][0] = local_48;
                ptr[uVar27][1] = lStack_40;
                uVar27 = uVar27 + 1;
                lVar19 = lVar19 - (ulong)(uint)gap;
              } while (uVar27 != uVar31);
              *ptr_06 = '\0';
              uVar27 = 1;
              do {
                iVar11 = -0x80;
                if (-0x80 < iVar24) {
                  iVar11 = (int8_t)iVar24;
                }
                if (s2_beg != 0) {
                  iVar11 = '\0';
                }
                ptr_06[uVar27] = iVar11;
                uVar27 = uVar27 + 1;
                iVar24 = iVar24 - gap;
              } while (s2Len + 1 != uVar27);
              palVar20 = ptr + uVar23;
              uVar27 = 1;
              if (1 < s2Len) {
                uVar27 = CONCAT44(0,s2Len);
              }
              lVar19 = (ulong)(uVar30 + (uVar30 == 0)) << 4;
              local_1a8[0] = auVar74[0];
              local_1a8[1] = auVar74[1];
              local_1a8[2] = auVar74[2];
              local_1a8[3] = auVar74[3];
              local_1a8[4] = auVar74[4];
              local_1a8[5] = auVar74[5];
              local_1a8[6] = auVar74[6];
              local_1a8[7] = auVar74[7];
              local_1a8[8] = auVar74[8];
              local_1a8[9] = auVar74[9];
              local_1a8[10] = auVar74[10];
              local_1a8[0xb] = auVar74[0xb];
              local_1a8[0xc] = auVar74[0xc];
              local_1a8[0xd] = auVar74[0xd];
              local_1a8[0xe] = auVar74[0xe];
              local_1a8[0xf] = auVar74[0xf];
              local_1a8[1] = -(local_1a8[1] == '\x0e');
              local_1a8[0] = -(local_1a8[0] == '\x0f');
              local_1a8[2] = -(local_1a8[2] == '\r');
              local_1a8[3] = -(local_1a8[3] == '\f');
              local_1a8[4] = -(local_1a8[4] == '\v');
              local_1a8[5] = -(local_1a8[5] == '\n');
              local_1a8[6] = -(local_1a8[6] == '\t');
              local_1a8[7] = -(local_1a8[7] == '\b');
              local_1a8[8] = -(local_1a8[8] == '\a');
              local_1a8[9] = -(local_1a8[9] == '\x06');
              local_1a8[10] = -(local_1a8[10] == '\x05');
              local_1a8[0xb] = -(local_1a8[0xb] == '\x04');
              local_1a8[0xc] = -(local_1a8[0xc] == '\x03');
              local_1a8[0xd] = -(local_1a8[0xd] == '\x02');
              local_1a8[0xe] = -(local_1a8[0xe] == '\x01');
              local_1a8[0xf] = -(local_1a8[0xf] == '\0');
              local_e8 = auVar73[0];
              bStack_e7 = auVar73[1];
              bStack_e6 = auVar73[2];
              bStack_e5 = auVar73[3];
              bStack_e4 = auVar73[4];
              bStack_e3 = auVar73[5];
              bStack_e2 = auVar73[6];
              bStack_e1 = auVar73[7];
              bStack_e0 = auVar73[8];
              bStack_df = auVar73[9];
              bStack_de = auVar73[10];
              bStack_dd = auVar73[0xb];
              bStack_dc = auVar73[0xc];
              bStack_db = auVar73[0xd];
              bStack_da = auVar73[0xe];
              bStack_d9 = auVar73[0xf];
              uVar86 = 0;
              auVar34 = auVar72;
              auVar77 = auVar72;
              auVar73 = auVar72;
              auVar74 = auVar72;
              auVar83 = auVar72;
              bVar116 = local_e8;
              bVar118 = bStack_e7;
              bVar120 = bStack_e6;
              bVar122 = bStack_e5;
              bVar124 = bStack_e4;
              bVar126 = bStack_e3;
              bVar128 = bStack_e2;
              bVar130 = bStack_e1;
              bVar132 = bStack_e0;
              bVar134 = bStack_df;
              bVar136 = bStack_de;
              bVar138 = bStack_dd;
              bVar140 = bStack_dc;
              bVar142 = bStack_db;
              bVar144 = bStack_da;
              bVar146 = bStack_d9;
              local_2b4 = iVar13;
              do {
                uVar55 = ptr[uVar18][0];
                uVar7 = b_03[uVar18][0];
                uVar8 = b_04[uVar18][0];
                uVar9 = b_05[uVar18][0];
                auVar113._8_8_ = ptr[uVar18][1] << 8 | uVar55 >> 0x38;
                auVar111._0_8_ = uVar7 << 8;
                auVar111._8_8_ = b_03[uVar18][1] << 8 | uVar7 >> 0x38;
                auVar110._0_8_ = uVar8 << 8;
                auVar110._8_8_ = b_04[uVar18][1] << 8 | uVar8 >> 0x38;
                auVar88._0_8_ = uVar9 << 8;
                auVar88._8_8_ = b_05[uVar18][1] << 8 | uVar9 >> 0x38;
                auVar113._0_8_ = uVar55 << 8 | (ulong)(byte)ptr_06[uVar86];
                lVar26 = uVar31 * (long)ppVar4->mapper[(byte)s2[uVar86]] * 0x10;
                auVar78 = psubsb(auVar72,(undefined1  [16])*ptr_04);
                auVar114 = (undefined1  [16])0x0;
                lVar29 = 0;
                local_288 = (undefined1  [16])0x0;
                local_258 = (undefined1  [16])0x0;
                auVar89 = auVar72;
                do {
                  auVar36 = *(undefined1 (*) [16])((long)*ptr + lVar29);
                  auVar79 = *(undefined1 (*) [16])((long)*b_03 + lVar29);
                  auVar180 = psubsb(auVar36,auVar70);
                  auVar149 = psubsb(*(undefined1 (*) [16])((long)*b + lVar29),auVar71);
                  cVar32 = auVar180[0];
                  cVar147 = auVar149[0];
                  auVar109[0] = -(cVar147 < cVar32);
                  cVar39 = auVar180[1];
                  cVar150 = auVar149[1];
                  auVar109[1] = -(cVar150 < cVar39);
                  cVar41 = auVar180[2];
                  cVar152 = auVar149[2];
                  auVar109[2] = -(cVar152 < cVar41);
                  cVar43 = auVar180[3];
                  cVar154 = auVar149[3];
                  auVar109[3] = -(cVar154 < cVar43);
                  cVar45 = auVar180[4];
                  cVar156 = auVar149[4];
                  auVar109[4] = -(cVar156 < cVar45);
                  cVar47 = auVar180[5];
                  cVar158 = auVar149[5];
                  auVar109[5] = -(cVar158 < cVar47);
                  cVar49 = auVar180[6];
                  cVar160 = auVar149[6];
                  auVar109[6] = -(cVar160 < cVar49);
                  cVar51 = auVar180[7];
                  cVar162 = auVar149[7];
                  auVar109[7] = -(cVar162 < cVar51);
                  cVar53 = auVar180[8];
                  cVar164 = auVar149[8];
                  auVar109[8] = -(cVar164 < cVar53);
                  cVar56 = auVar180[9];
                  cVar166 = auVar149[9];
                  auVar109[9] = -(cVar166 < cVar56);
                  cVar58 = auVar180[10];
                  cVar168 = auVar149[10];
                  auVar109[10] = -(cVar168 < cVar58);
                  cVar60 = auVar180[0xb];
                  cVar170 = auVar149[0xb];
                  auVar109[0xb] = -(cVar170 < cVar60);
                  cVar62 = auVar180[0xc];
                  cVar172 = auVar149[0xc];
                  auVar109[0xc] = -(cVar172 < cVar62);
                  cVar64 = auVar180[0xd];
                  cVar174 = auVar149[0xd];
                  auVar109[0xd] = -(cVar174 < cVar64);
                  cVar66 = auVar180[0xe];
                  cVar176 = auVar149[0xe];
                  cVar68 = auVar180[0xf];
                  auVar109[0xe] = -(cVar176 < cVar66);
                  cVar178 = auVar149[0xf];
                  auVar109[0xf] = -(cVar178 < cVar68);
                  auVar108 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar29),auVar79,auVar109)
                  ;
                  auVar149 = *(undefined1 (*) [16])((long)*b_04 + lVar29);
                  auVar84 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar29),auVar149,auVar109)
                  ;
                  auVar180 = *(undefined1 (*) [16])((long)*b_05 + lVar29);
                  auVar109 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar29),auVar180,auVar109
                                     );
                  auVar78 = paddsb(auVar78,*(undefined1 (*) [16])((long)*ptr_04 + lVar29));
                  cVar33 = auVar78[0];
                  cVar115 = auVar89[0];
                  auVar182[0] = -(cVar115 < cVar33);
                  cVar40 = auVar78[1];
                  cVar117 = auVar89[1];
                  auVar182[1] = -(cVar117 < cVar40);
                  cVar42 = auVar78[2];
                  cVar119 = auVar89[2];
                  auVar182[2] = -(cVar119 < cVar42);
                  cVar44 = auVar78[3];
                  cVar121 = auVar89[3];
                  auVar182[3] = -(cVar121 < cVar44);
                  cVar46 = auVar78[4];
                  cVar123 = auVar89[4];
                  auVar182[4] = -(cVar123 < cVar46);
                  cVar48 = auVar78[5];
                  cVar125 = auVar89[5];
                  auVar182[5] = -(cVar125 < cVar48);
                  cVar50 = auVar78[6];
                  cVar127 = auVar89[6];
                  auVar182[6] = -(cVar127 < cVar50);
                  cVar52 = auVar78[7];
                  cVar129 = auVar89[7];
                  auVar182[7] = -(cVar129 < cVar52);
                  cVar54 = auVar78[8];
                  cVar131 = auVar89[8];
                  auVar182[8] = -(cVar131 < cVar54);
                  cVar57 = auVar78[9];
                  cVar133 = auVar89[9];
                  auVar182[9] = -(cVar133 < cVar57);
                  cVar59 = auVar78[10];
                  cVar135 = auVar89[10];
                  auVar182[10] = -(cVar135 < cVar59);
                  cVar61 = auVar78[0xb];
                  cVar137 = auVar89[0xb];
                  auVar182[0xb] = -(cVar137 < cVar61);
                  cVar63 = auVar78[0xc];
                  cVar139 = auVar89[0xc];
                  auVar182[0xc] = -(cVar139 < cVar63);
                  cVar65 = auVar78[0xd];
                  cVar141 = auVar89[0xd];
                  auVar182[0xd] = -(cVar141 < cVar65);
                  cVar67 = auVar78[0xe];
                  cVar143 = auVar89[0xe];
                  cVar69 = auVar78[0xf];
                  auVar182[0xe] = -(cVar143 < cVar67);
                  cVar145 = auVar89[0xf];
                  auVar182[0xf] = -(cVar145 < cVar69);
                  local_258 = pblendvb(local_258,local_268,auVar182);
                  local_288 = pblendvb(local_288,local_238,auVar182);
                  bVar148 = (cVar147 < cVar32) * cVar32 | (cVar147 >= cVar32) * cVar147;
                  bVar151 = (cVar150 < cVar39) * cVar39 | (cVar150 >= cVar39) * cVar150;
                  bVar153 = (cVar152 < cVar41) * cVar41 | (cVar152 >= cVar41) * cVar152;
                  bVar155 = (cVar154 < cVar43) * cVar43 | (cVar154 >= cVar43) * cVar154;
                  bVar157 = (cVar156 < cVar45) * cVar45 | (cVar156 >= cVar45) * cVar156;
                  bVar159 = (cVar158 < cVar47) * cVar47 | (cVar158 >= cVar47) * cVar158;
                  bVar161 = (cVar160 < cVar49) * cVar49 | (cVar160 >= cVar49) * cVar160;
                  bVar163 = (cVar162 < cVar51) * cVar51 | (cVar162 >= cVar51) * cVar162;
                  bVar165 = (cVar164 < cVar53) * cVar53 | (cVar164 >= cVar53) * cVar164;
                  bVar167 = (cVar166 < cVar56) * cVar56 | (cVar166 >= cVar56) * cVar166;
                  bVar169 = (cVar168 < cVar58) * cVar58 | (cVar168 >= cVar58) * cVar168;
                  bVar171 = (cVar170 < cVar60) * cVar60 | (cVar170 >= cVar60) * cVar170;
                  bVar173 = (cVar172 < cVar62) * cVar62 | (cVar172 >= cVar62) * cVar172;
                  bVar175 = (cVar174 < cVar64) * cVar64 | (cVar174 >= cVar64) * cVar174;
                  bVar177 = (cVar176 < cVar66) * cVar66 | (cVar176 >= cVar66) * cVar176;
                  bVar179 = (cVar178 < cVar68) * cVar68 | (cVar178 >= cVar68) * cVar178;
                  auVar89[0] = (cVar33 < cVar115) * cVar115 | (cVar33 >= cVar115) * cVar33;
                  auVar89[1] = (cVar40 < cVar117) * cVar117 | (cVar40 >= cVar117) * cVar40;
                  auVar89[2] = (cVar42 < cVar119) * cVar119 | (cVar42 >= cVar119) * cVar42;
                  auVar89[3] = (cVar44 < cVar121) * cVar121 | (cVar44 >= cVar121) * cVar44;
                  auVar89[4] = (cVar46 < cVar123) * cVar123 | (cVar46 >= cVar123) * cVar46;
                  auVar89[5] = (cVar48 < cVar125) * cVar125 | (cVar48 >= cVar125) * cVar48;
                  auVar89[6] = (cVar50 < cVar127) * cVar127 | (cVar50 >= cVar127) * cVar50;
                  auVar89[7] = (cVar52 < cVar129) * cVar129 | (cVar52 >= cVar129) * cVar52;
                  auVar89[8] = (cVar54 < cVar131) * cVar131 | (cVar54 >= cVar131) * cVar54;
                  auVar89[9] = (cVar57 < cVar133) * cVar133 | (cVar57 >= cVar133) * cVar57;
                  auVar89[10] = (cVar59 < cVar135) * cVar135 | (cVar59 >= cVar135) * cVar59;
                  auVar89[0xb] = (cVar61 < cVar137) * cVar137 | (cVar61 >= cVar137) * cVar61;
                  auVar89[0xc] = (cVar63 < cVar139) * cVar139 | (cVar63 >= cVar139) * cVar63;
                  auVar89[0xd] = (cVar65 < cVar141) * cVar141 | (cVar65 >= cVar141) * cVar65;
                  auVar89[0xe] = (cVar67 < cVar143) * cVar143 | (cVar67 >= cVar143) * cVar67;
                  auVar89[0xf] = (cVar69 < cVar145) * cVar145 | (cVar69 >= cVar145) * cVar69;
                  auVar78 = paddsb(in_XMM11,*(undefined1 (*) [16])((long)*ptr_05 + lVar29));
                  auVar114 = pblendvb(auVar114,auVar78,auVar182);
                  auVar182 = paddsb(auVar113,*(undefined1 (*) [16])((long)pvVar3 + lVar29 + lVar26))
                  ;
                  auVar113 = paddsb(auVar111,*(undefined1 (*) [16])((long)pvVar5 + lVar29 + lVar26))
                  ;
                  auVar111 = paddsb(auVar110,*(undefined1 (*) [16])((long)pvVar6 + lVar29 + lVar26))
                  ;
                  cVar32 = auVar182[0];
                  auVar35[0] = -(cVar32 < (char)bVar148);
                  cVar33 = auVar182[1];
                  auVar35[1] = -(cVar33 < (char)bVar151);
                  cVar39 = auVar182[2];
                  auVar35[2] = -(cVar39 < (char)bVar153);
                  cVar40 = auVar182[3];
                  auVar35[3] = -(cVar40 < (char)bVar155);
                  cVar41 = auVar182[4];
                  auVar35[4] = -(cVar41 < (char)bVar157);
                  cVar42 = auVar182[5];
                  auVar35[5] = -(cVar42 < (char)bVar159);
                  cVar43 = auVar182[6];
                  auVar35[6] = -(cVar43 < (char)bVar161);
                  cVar44 = auVar182[7];
                  auVar35[7] = -(cVar44 < (char)bVar163);
                  cVar45 = auVar182[8];
                  auVar35[8] = -(cVar45 < (char)bVar165);
                  cVar46 = auVar182[9];
                  auVar35[9] = -(cVar46 < (char)bVar167);
                  cVar47 = auVar182[10];
                  auVar35[10] = -(cVar47 < (char)bVar169);
                  cVar48 = auVar182[0xb];
                  auVar35[0xb] = -(cVar48 < (char)bVar171);
                  cVar49 = auVar182[0xc];
                  auVar35[0xc] = -(cVar49 < (char)bVar173);
                  cVar50 = auVar182[0xd];
                  auVar35[0xd] = -(cVar50 < (char)bVar175);
                  cVar51 = auVar182[0xe];
                  auVar35[0xe] = -(cVar51 < (char)bVar177);
                  cVar52 = auVar182[0xf];
                  auVar35[0xf] = -(cVar52 < (char)bVar179);
                  local_268 = pblendvb(auVar113,auVar108,auVar35);
                  local_238 = pblendvb(auVar111,auVar84,auVar35);
                  auVar110 = paddsb(auVar109,_DAT_008d0c20);
                  auVar88 = paddsb(auVar88,_DAT_008d0c20);
                  in_XMM11 = pblendvb(auVar88,auVar110,auVar35);
                  pbVar1 = (byte *)((long)*b + lVar29);
                  *pbVar1 = bVar148;
                  pbVar1[1] = bVar151;
                  pbVar1[2] = bVar153;
                  pbVar1[3] = bVar155;
                  pbVar1[4] = bVar157;
                  pbVar1[5] = bVar159;
                  pbVar1[6] = bVar161;
                  pbVar1[7] = bVar163;
                  pbVar1[8] = bVar165;
                  pbVar1[9] = bVar167;
                  pbVar1[10] = bVar169;
                  pbVar1[0xb] = bVar171;
                  pbVar1[0xc] = bVar173;
                  pbVar1[0xd] = bVar175;
                  pbVar1[0xe] = bVar177;
                  pbVar1[0xf] = bVar179;
                  *(undefined1 (*) [16])((long)*b_00 + lVar29) = auVar108;
                  *(undefined1 (*) [16])((long)*b_01 + lVar29) = auVar84;
                  *(undefined1 (*) [16])((long)*b_02 + lVar29) = auVar110;
                  bVar148 = ((char)bVar148 < cVar32) * cVar32 | ((char)bVar148 >= cVar32) * bVar148;
                  bVar151 = ((char)bVar151 < cVar33) * cVar33 | ((char)bVar151 >= cVar33) * bVar151;
                  bVar153 = ((char)bVar153 < cVar39) * cVar39 | ((char)bVar153 >= cVar39) * bVar153;
                  bVar155 = ((char)bVar155 < cVar40) * cVar40 | ((char)bVar155 >= cVar40) * bVar155;
                  bVar157 = ((char)bVar157 < cVar41) * cVar41 | ((char)bVar157 >= cVar41) * bVar157;
                  bVar159 = ((char)bVar159 < cVar42) * cVar42 | ((char)bVar159 >= cVar42) * bVar159;
                  bVar161 = ((char)bVar161 < cVar43) * cVar43 | ((char)bVar161 >= cVar43) * bVar161;
                  bVar163 = ((char)bVar163 < cVar44) * cVar44 | ((char)bVar163 >= cVar44) * bVar163;
                  auVar78._0_8_ =
                       CONCAT17(bVar163,CONCAT16(bVar161,CONCAT15(bVar159,CONCAT14(bVar157,CONCAT13(
                                                  bVar155,CONCAT12(bVar153,CONCAT11(bVar151,bVar148)
                                                                  ))))));
                  auVar78[8] = ((char)bVar165 < cVar45) * cVar45 |
                               ((char)bVar165 >= cVar45) * bVar165;
                  auVar78[9] = ((char)bVar167 < cVar46) * cVar46 |
                               ((char)bVar167 >= cVar46) * bVar167;
                  auVar78[10] = ((char)bVar169 < cVar47) * cVar47 |
                                ((char)bVar169 >= cVar47) * bVar169;
                  auVar78[0xb] = ((char)bVar171 < cVar48) * cVar48 |
                                 ((char)bVar171 >= cVar48) * bVar171;
                  auVar78[0xc] = ((char)bVar173 < cVar49) * cVar49 |
                                 ((char)bVar173 >= cVar49) * bVar173;
                  auVar78[0xd] = ((char)bVar175 < cVar50) * cVar50 |
                                 ((char)bVar175 >= cVar50) * bVar175;
                  auVar78[0xe] = ((char)bVar177 < cVar51) * cVar51 |
                                 ((char)bVar177 >= cVar51) * bVar177;
                  auVar78[0xf] = ((char)bVar179 < cVar52) * cVar52 |
                                 ((char)bVar179 >= cVar52) * bVar179;
                  *(undefined1 (*) [16])((long)*ptr + lVar29) = auVar182;
                  *(undefined1 (*) [16])((long)*b_03 + lVar29) = auVar113;
                  *(undefined1 (*) [16])((long)*b_04 + lVar29) = auVar111;
                  *(undefined1 (*) [16])((long)*b_05 + lVar29) = auVar88;
                  auVar109 = _DAT_008d0c20;
                  lVar29 = lVar29 + 0x10;
                  auVar88 = auVar180;
                  auVar110 = auVar149;
                  auVar111 = auVar79;
                  auVar113 = auVar36;
                } while (lVar19 != lVar29);
                auVar79._8_8_ = auVar78._8_8_ << 8 | (ulong)bVar163;
                lVar26 = local_268._8_8_;
                uVar55 = local_268._0_8_;
                local_268._0_8_ = uVar55 << 8;
                local_268._8_8_ = lVar26 << 8 | uVar55 >> 0x38;
                lVar26 = local_238._8_8_;
                uVar55 = local_238._0_8_;
                local_238._0_8_ = uVar55 << 8;
                local_238._8_8_ = lVar26 << 8 | uVar55 >> 0x38;
                lVar26 = in_XMM11._8_8_;
                uVar55 = in_XMM11._0_8_;
                in_XMM11._0_8_ = uVar55 << 8;
                in_XMM11._8_8_ = lVar26 << 8 | uVar55 >> 0x38;
                bVar165 = ptr_06[uVar86 + 1];
                auVar79._0_8_ = auVar78._0_8_ << 8 | (ulong)bVar165;
                uVar55 = uVar86 + 1;
                auVar88 = paddsb((undefined1  [16])*ptr_04,auVar79);
                cVar32 = auVar88[0];
                auVar36[0] = -(cVar32 < (char)auVar89[0]);
                cVar33 = auVar88[1];
                auVar36[1] = -(cVar33 < (char)auVar89[1]);
                cVar39 = auVar88[2];
                auVar36[2] = -(cVar39 < (char)auVar89[2]);
                cVar40 = auVar88[3];
                auVar36[3] = -(cVar40 < (char)auVar89[3]);
                cVar41 = auVar88[4];
                auVar36[4] = -(cVar41 < (char)auVar89[4]);
                cVar42 = auVar88[5];
                auVar36[5] = -(cVar42 < (char)auVar89[5]);
                cVar43 = auVar88[6];
                auVar36[6] = -(cVar43 < (char)auVar89[6]);
                cVar44 = auVar88[7];
                auVar36[7] = -(cVar44 < (char)auVar89[7]);
                cVar45 = auVar88[8];
                auVar36[8] = -(cVar45 < (char)auVar89[8]);
                cVar46 = auVar88[9];
                auVar36[9] = -(cVar46 < (char)auVar89[9]);
                cVar47 = auVar88[10];
                auVar36[10] = -(cVar47 < (char)auVar89[10]);
                cVar48 = auVar88[0xb];
                auVar36[0xb] = -(cVar48 < (char)auVar89[0xb]);
                cVar49 = auVar88[0xc];
                auVar36[0xc] = -(cVar49 < (char)auVar89[0xc]);
                cVar50 = auVar88[0xd];
                auVar36[0xd] = -(cVar50 < (char)auVar89[0xd]);
                cVar51 = auVar88[0xe];
                auVar36[0xe] = -(cVar51 < (char)auVar89[0xe]);
                cVar52 = auVar88[0xf];
                auVar36[0xf] = -(cVar52 < (char)auVar89[0xf]);
                auVar149[0] = (cVar32 < (char)auVar89[0]) * auVar89[0] |
                              (cVar32 >= (char)auVar89[0]) * cVar32;
                auVar149[1] = (cVar33 < (char)auVar89[1]) * auVar89[1] |
                              (cVar33 >= (char)auVar89[1]) * cVar33;
                auVar149[2] = (cVar39 < (char)auVar89[2]) * auVar89[2] |
                              (cVar39 >= (char)auVar89[2]) * cVar39;
                auVar149[3] = (cVar40 < (char)auVar89[3]) * auVar89[3] |
                              (cVar40 >= (char)auVar89[3]) * cVar40;
                auVar149[4] = (cVar41 < (char)auVar89[4]) * auVar89[4] |
                              (cVar41 >= (char)auVar89[4]) * cVar41;
                auVar149[5] = (cVar42 < (char)auVar89[5]) * auVar89[5] |
                              (cVar42 >= (char)auVar89[5]) * cVar42;
                auVar149[6] = (cVar43 < (char)auVar89[6]) * auVar89[6] |
                              (cVar43 >= (char)auVar89[6]) * cVar43;
                auVar149[7] = (cVar44 < (char)auVar89[7]) * auVar89[7] |
                              (cVar44 >= (char)auVar89[7]) * cVar44;
                auVar149[8] = (cVar45 < (char)auVar89[8]) * auVar89[8] |
                              (cVar45 >= (char)auVar89[8]) * cVar45;
                auVar149[9] = (cVar46 < (char)auVar89[9]) * auVar89[9] |
                              (cVar46 >= (char)auVar89[9]) * cVar46;
                auVar149[10] = (cVar47 < (char)auVar89[10]) * auVar89[10] |
                               (cVar47 >= (char)auVar89[10]) * cVar47;
                auVar149[0xb] =
                     (cVar48 < (char)auVar89[0xb]) * auVar89[0xb] |
                     (cVar48 >= (char)auVar89[0xb]) * cVar48;
                auVar149[0xc] =
                     (cVar49 < (char)auVar89[0xc]) * auVar89[0xc] |
                     (cVar49 >= (char)auVar89[0xc]) * cVar49;
                auVar149[0xd] =
                     (cVar50 < (char)auVar89[0xd]) * auVar89[0xd] |
                     (cVar50 >= (char)auVar89[0xd]) * cVar50;
                auVar149[0xe] =
                     (cVar51 < (char)auVar89[0xe]) * auVar89[0xe] |
                     (cVar51 >= (char)auVar89[0xe]) * cVar51;
                auVar149[0xf] =
                     (cVar52 < (char)auVar89[0xf]) * auVar89[0xf] |
                     (cVar52 >= (char)auVar89[0xf]) * cVar52;
                auVar110 = pblendvb(local_268,local_258,auVar36);
                auVar111 = pblendvb(local_238,local_288,auVar36);
                auVar88 = paddsb((undefined1  [16])*ptr_05,in_XMM11);
                auVar88 = pblendvb(auVar88,auVar114,auVar36);
                iVar25 = 0xe;
                do {
                  auVar180._0_8_ = auVar149._0_8_ << 8;
                  auVar180._8_8_ = auVar149._8_8_ << 8 | auVar149._0_8_ >> 0x38;
                  auVar89 = paddsb(auVar180,auVar76);
                  auVar108._0_8_ = auVar110._0_8_ << 8;
                  auVar108._8_8_ = auVar110._8_8_ << 8 | auVar110._0_8_ >> 0x38;
                  cVar32 = auVar149[0];
                  cVar53 = auVar89[0];
                  auVar114[0] = -(cVar53 < cVar32);
                  cVar33 = auVar149[1];
                  cVar54 = auVar89[1];
                  auVar114[1] = -(cVar54 < cVar33);
                  cVar39 = auVar149[2];
                  cVar56 = auVar89[2];
                  auVar114[2] = -(cVar56 < cVar39);
                  cVar40 = auVar149[3];
                  cVar57 = auVar89[3];
                  auVar114[3] = -(cVar57 < cVar40);
                  cVar41 = auVar149[4];
                  cVar58 = auVar89[4];
                  auVar114[4] = -(cVar58 < cVar41);
                  cVar42 = auVar149[5];
                  cVar59 = auVar89[5];
                  auVar114[5] = -(cVar59 < cVar42);
                  cVar43 = auVar149[6];
                  cVar60 = auVar89[6];
                  auVar114[6] = -(cVar60 < cVar43);
                  cVar44 = auVar149[7];
                  cVar61 = auVar89[7];
                  auVar114[7] = -(cVar61 < cVar44);
                  cVar45 = auVar149[8];
                  cVar62 = auVar89[8];
                  auVar114[8] = -(cVar62 < cVar45);
                  cVar46 = auVar149[9];
                  cVar63 = auVar89[9];
                  auVar114[9] = -(cVar63 < cVar46);
                  cVar47 = auVar149[10];
                  cVar64 = auVar89[10];
                  auVar114[10] = -(cVar64 < cVar47);
                  cVar48 = auVar149[0xb];
                  cVar65 = auVar89[0xb];
                  auVar114[0xb] = -(cVar65 < cVar48);
                  cVar49 = auVar149[0xc];
                  cVar66 = auVar89[0xc];
                  auVar114[0xc] = -(cVar66 < cVar49);
                  cVar50 = auVar149[0xd];
                  cVar67 = auVar89[0xd];
                  auVar114[0xd] = -(cVar67 < cVar50);
                  cVar51 = auVar149[0xe];
                  cVar68 = auVar89[0xe];
                  cVar52 = auVar149[0xf];
                  auVar114[0xe] = -(cVar68 < cVar51);
                  cVar69 = auVar89[0xf];
                  auVar114[0xf] = -(cVar69 < cVar52);
                  auVar110 = pblendvb(auVar108,auVar110,auVar114);
                  auVar183._0_8_ = auVar111._0_8_ << 8;
                  auVar183._8_8_ = auVar111._8_8_ << 8 | auVar111._0_8_ >> 0x38;
                  auVar84._0_8_ = auVar88._0_8_ << 8;
                  auVar84._8_8_ = auVar88._8_8_ << 8 | auVar88._0_8_ >> 0x38;
                  auVar89 = paddsb(auVar84,auVar75);
                  bVar167 = (cVar61 < cVar44) * cVar44 | (cVar61 >= cVar44) * cVar61;
                  auVar149._0_8_ =
                       CONCAT17(bVar167,CONCAT16((cVar60 < cVar43) * cVar43 |
                                                 (cVar60 >= cVar43) * cVar60,
                                                 CONCAT15((cVar59 < cVar42) * cVar42 |
                                                          (cVar59 >= cVar42) * cVar59,
                                                          CONCAT14((cVar58 < cVar41) * cVar41 |
                                                                   (cVar58 >= cVar41) * cVar58,
                                                                   CONCAT13((cVar57 < cVar40) *
                                                                            cVar40 | (cVar57 >=
                                                                                     cVar40) * 
                                                  cVar57,CONCAT12((cVar56 < cVar39) * cVar39 |
                                                                  (cVar56 >= cVar39) * cVar56,
                                                                  CONCAT11((cVar54 < cVar33) *
                                                                           cVar33 | (cVar54 >=
                                                                                    cVar33) * cVar54
                                                                           ,(cVar53 < cVar32) *
                                                                            cVar32 | (cVar53 >=
                                                                                     cVar32) * 
                                                  cVar53)))))));
                  auVar149[8] = (cVar62 < cVar45) * cVar45 | (cVar62 >= cVar45) * cVar62;
                  auVar149[9] = (cVar63 < cVar46) * cVar46 | (cVar63 >= cVar46) * cVar63;
                  auVar149[10] = (cVar64 < cVar47) * cVar47 | (cVar64 >= cVar47) * cVar64;
                  auVar149[0xb] = (cVar65 < cVar48) * cVar48 | (cVar65 >= cVar48) * cVar65;
                  auVar149[0xc] = (cVar66 < cVar49) * cVar49 | (cVar66 >= cVar49) * cVar66;
                  auVar149[0xd] = (cVar67 < cVar50) * cVar50 | (cVar67 >= cVar50) * cVar67;
                  auVar149[0xe] = (cVar68 < cVar51) * cVar51 | (cVar68 >= cVar51) * cVar68;
                  auVar149[0xf] = (cVar69 < cVar52) * cVar52 | (cVar69 >= cVar52) * cVar69;
                  auVar111 = pblendvb(auVar183,auVar111,auVar114);
                  auVar88 = pblendvb(auVar89,auVar88,auVar114);
                  iVar25 = iVar25 + -1;
                } while (iVar25 != 0);
                auVar90._0_8_ = auVar149._0_8_ << 8;
                auVar90._8_8_ = auVar149._8_8_ << 8 | (ulong)bVar167;
                auVar181._0_8_ = auVar110._0_8_ << 8;
                auVar181._8_8_ = auVar110._8_8_ << 8 | auVar110._0_8_ >> 0x38;
                auVar184._0_8_ = auVar111._0_8_ << 8;
                auVar184._8_8_ = auVar111._8_8_ << 8 | auVar111._0_8_ >> 0x38;
                auVar112._0_8_ = auVar88._0_8_ << 8;
                auVar112._8_8_ = auVar88._8_8_ << 8 | auVar88._0_8_ >> 0x38;
                auVar91 = paddsb(auVar90,auVar82);
                cVar32 = auVar91[0];
                auVar37[0] = -((char)bVar165 < cVar32);
                cVar33 = auVar91[1];
                auVar37[1] = -((char)bVar148 < cVar33);
                cVar39 = auVar91[2];
                auVar37[2] = -((char)bVar151 < cVar39);
                cVar40 = auVar91[3];
                auVar37[3] = -((char)bVar153 < cVar40);
                cVar41 = auVar91[4];
                auVar37[4] = -((char)bVar155 < cVar41);
                cVar42 = auVar91[5];
                auVar37[5] = -((char)bVar157 < cVar42);
                cVar43 = auVar91[6];
                auVar37[6] = -((char)bVar159 < cVar43);
                cVar44 = auVar91[7];
                auVar37[7] = -((char)bVar161 < cVar44);
                cVar45 = auVar91[8];
                auVar37[8] = -((char)bVar163 < cVar45);
                cVar46 = auVar91[9];
                auVar37[9] = -((char)auVar78[8] < cVar46);
                cVar47 = auVar91[10];
                auVar37[10] = -((char)auVar78[9] < cVar47);
                cVar48 = auVar91[0xb];
                auVar37[0xb] = -((char)auVar78[10] < cVar48);
                cVar49 = auVar91[0xc];
                auVar37[0xc] = -((char)auVar78[0xb] < cVar49);
                cVar50 = auVar91[0xd];
                auVar37[0xd] = -((char)auVar78[0xc] < cVar50);
                cVar51 = auVar91[0xe];
                cVar52 = auVar91[0xf];
                auVar37[0xe] = -((char)auVar78[0xd] < cVar51);
                auVar37[0xf] = -((char)auVar78[0xe] < cVar52);
                auVar80[0] = ((char)bVar165 < cVar32) * cVar32 | ((char)bVar165 >= cVar32) * bVar165
                ;
                auVar80[1] = ((char)bVar148 < cVar33) * cVar33 | ((char)bVar148 >= cVar33) * bVar148
                ;
                auVar80[2] = ((char)bVar151 < cVar39) * cVar39 | ((char)bVar151 >= cVar39) * bVar151
                ;
                auVar80[3] = ((char)bVar153 < cVar40) * cVar40 | ((char)bVar153 >= cVar40) * bVar153
                ;
                auVar80[4] = ((char)bVar155 < cVar41) * cVar41 | ((char)bVar155 >= cVar41) * bVar155
                ;
                auVar80[5] = ((char)bVar157 < cVar42) * cVar42 | ((char)bVar157 >= cVar42) * bVar157
                ;
                auVar80[6] = ((char)bVar159 < cVar43) * cVar43 | ((char)bVar159 >= cVar43) * bVar159
                ;
                auVar80[7] = ((char)bVar161 < cVar44) * cVar44 | ((char)bVar161 >= cVar44) * bVar161
                ;
                auVar80[8] = ((char)bVar163 < cVar45) * cVar45 | ((char)bVar163 >= cVar45) * bVar163
                ;
                auVar80[9] = ((char)auVar78[8] < cVar46) * cVar46 |
                             ((char)auVar78[8] >= cVar46) * auVar78[8];
                auVar80[10] = ((char)auVar78[9] < cVar47) * cVar47 |
                              ((char)auVar78[9] >= cVar47) * auVar78[9];
                auVar80[0xb] = ((char)auVar78[10] < cVar48) * cVar48 |
                               ((char)auVar78[10] >= cVar48) * auVar78[10];
                auVar80[0xc] = ((char)auVar78[0xb] < cVar49) * cVar49 |
                               ((char)auVar78[0xb] >= cVar49) * auVar78[0xb];
                auVar80[0xd] = ((char)auVar78[0xc] < cVar50) * cVar50 |
                               ((char)auVar78[0xc] >= cVar50) * auVar78[0xc];
                auVar80[0xe] = ((char)auVar78[0xd] < cVar51) * cVar51 |
                               ((char)auVar78[0xd] >= cVar51) * auVar78[0xd];
                auVar80[0xf] = ((char)auVar78[0xe] < cVar52) * cVar52 |
                               ((char)auVar78[0xe] >= cVar52) * auVar78[0xe];
                auVar110 = pblendvb(local_268,auVar181,auVar37);
                auVar88 = pblendvb(local_238,auVar184,auVar37);
                auVar111 = pblendvb(in_XMM11,auVar112,auVar37);
                lVar26 = 0;
                do {
                  auVar89 = psubsb(auVar80,auVar70);
                  auVar113 = psubsb(auVar91,auVar71);
                  cVar32 = auVar89[0];
                  cVar53 = auVar113[0];
                  auVar81[0] = -(cVar53 < cVar32);
                  cVar33 = auVar89[1];
                  cVar54 = auVar113[1];
                  auVar81[1] = -(cVar54 < cVar33);
                  cVar39 = auVar89[2];
                  cVar56 = auVar113[2];
                  auVar81[2] = -(cVar56 < cVar39);
                  cVar40 = auVar89[3];
                  cVar57 = auVar113[3];
                  auVar81[3] = -(cVar57 < cVar40);
                  cVar41 = auVar89[4];
                  cVar58 = auVar113[4];
                  auVar81[4] = -(cVar58 < cVar41);
                  cVar42 = auVar89[5];
                  cVar59 = auVar113[5];
                  auVar81[5] = -(cVar59 < cVar42);
                  cVar43 = auVar89[6];
                  cVar60 = auVar113[6];
                  auVar81[6] = -(cVar60 < cVar43);
                  cVar44 = auVar89[7];
                  cVar61 = auVar113[7];
                  auVar81[7] = -(cVar61 < cVar44);
                  cVar45 = auVar89[8];
                  cVar62 = auVar113[8];
                  auVar81[8] = -(cVar62 < cVar45);
                  cVar46 = auVar89[9];
                  cVar63 = auVar113[9];
                  auVar81[9] = -(cVar63 < cVar46);
                  cVar47 = auVar89[10];
                  cVar64 = auVar113[10];
                  auVar81[10] = -(cVar64 < cVar47);
                  cVar48 = auVar89[0xb];
                  cVar65 = auVar113[0xb];
                  auVar81[0xb] = -(cVar65 < cVar48);
                  cVar49 = auVar89[0xc];
                  cVar66 = auVar113[0xc];
                  auVar81[0xc] = -(cVar66 < cVar49);
                  cVar50 = auVar89[0xd];
                  cVar67 = auVar113[0xd];
                  auVar81[0xd] = -(cVar67 < cVar50);
                  cVar51 = auVar89[0xe];
                  cVar68 = auVar113[0xe];
                  cVar52 = auVar89[0xf];
                  auVar81[0xe] = -(cVar68 < cVar51);
                  cVar69 = auVar113[0xf];
                  auVar81[0xf] = -(cVar69 < cVar52);
                  auVar181 = pblendvb(auVar181,auVar110,auVar81);
                  auVar184 = pblendvb(auVar184,auVar88,auVar81);
                  pbVar1 = (byte *)((long)*ptr + lVar26);
                  bVar148 = *pbVar1;
                  bVar151 = pbVar1[1];
                  bVar153 = pbVar1[2];
                  bVar155 = pbVar1[3];
                  bVar157 = pbVar1[4];
                  bVar159 = pbVar1[5];
                  bVar161 = pbVar1[6];
                  bVar163 = pbVar1[7];
                  bVar165 = pbVar1[8];
                  bVar167 = pbVar1[9];
                  bVar169 = pbVar1[10];
                  bVar171 = pbVar1[0xb];
                  bVar173 = pbVar1[0xc];
                  bVar175 = pbVar1[0xd];
                  bVar177 = pbVar1[0xe];
                  bVar179 = pbVar1[0xf];
                  auVar88 = pblendvb(auVar112,auVar111,auVar81);
                  auVar91[0] = (cVar32 < cVar53) * cVar53 | (cVar32 >= cVar53) * cVar32;
                  auVar91[1] = (cVar33 < cVar54) * cVar54 | (cVar33 >= cVar54) * cVar33;
                  auVar91[2] = (cVar39 < cVar56) * cVar56 | (cVar39 >= cVar56) * cVar39;
                  auVar91[3] = (cVar40 < cVar57) * cVar57 | (cVar40 >= cVar57) * cVar40;
                  auVar91[4] = (cVar41 < cVar58) * cVar58 | (cVar41 >= cVar58) * cVar41;
                  auVar91[5] = (cVar42 < cVar59) * cVar59 | (cVar42 >= cVar59) * cVar42;
                  auVar91[6] = (cVar43 < cVar60) * cVar60 | (cVar43 >= cVar60) * cVar43;
                  auVar91[7] = (cVar44 < cVar61) * cVar61 | (cVar44 >= cVar61) * cVar44;
                  auVar91[8] = (cVar45 < cVar62) * cVar62 | (cVar45 >= cVar62) * cVar45;
                  auVar91[9] = (cVar46 < cVar63) * cVar63 | (cVar46 >= cVar63) * cVar46;
                  auVar91[10] = (cVar47 < cVar64) * cVar64 | (cVar47 >= cVar64) * cVar47;
                  auVar91[0xb] = (cVar48 < cVar65) * cVar65 | (cVar48 >= cVar65) * cVar48;
                  auVar91[0xc] = (cVar49 < cVar66) * cVar66 | (cVar49 >= cVar66) * cVar49;
                  auVar91[0xd] = (cVar50 < cVar67) * cVar67 | (cVar50 >= cVar67) * cVar50;
                  auVar91[0xe] = (cVar51 < cVar68) * cVar68 | (cVar51 >= cVar68) * cVar51;
                  auVar91[0xf] = (cVar52 < cVar69) * cVar69 | (cVar52 >= cVar69) * cVar52;
                  pcVar2 = (char *)((long)*b + lVar26);
                  cVar32 = *pcVar2;
                  cVar33 = pcVar2[1];
                  cVar39 = pcVar2[2];
                  cVar40 = pcVar2[3];
                  cVar41 = pcVar2[4];
                  cVar42 = pcVar2[5];
                  cVar43 = pcVar2[6];
                  cVar44 = pcVar2[7];
                  cVar45 = pcVar2[8];
                  cVar46 = pcVar2[9];
                  cVar47 = pcVar2[10];
                  cVar48 = pcVar2[0xb];
                  cVar49 = pcVar2[0xc];
                  cVar50 = pcVar2[0xd];
                  cVar51 = pcVar2[0xe];
                  cVar52 = pcVar2[0xf];
                  bVar87 = (cVar32 < (char)bVar148) * bVar148 | (cVar32 >= (char)bVar148) * cVar32;
                  bVar93 = (cVar33 < (char)bVar151) * bVar151 | (cVar33 >= (char)bVar151) * cVar33;
                  bVar94 = (cVar39 < (char)bVar153) * bVar153 | (cVar39 >= (char)bVar153) * cVar39;
                  bVar95 = (cVar40 < (char)bVar155) * bVar155 | (cVar40 >= (char)bVar155) * cVar40;
                  bVar96 = (cVar41 < (char)bVar157) * bVar157 | (cVar41 >= (char)bVar157) * cVar41;
                  bVar97 = (cVar42 < (char)bVar159) * bVar159 | (cVar42 >= (char)bVar159) * cVar42;
                  bVar98 = (cVar43 < (char)bVar161) * bVar161 | (cVar43 >= (char)bVar161) * cVar43;
                  bVar99 = (cVar44 < (char)bVar163) * bVar163 | (cVar44 >= (char)bVar163) * cVar44;
                  bVar100 = (cVar45 < (char)bVar165) * bVar165 | (cVar45 >= (char)bVar165) * cVar45;
                  bVar101 = (cVar46 < (char)bVar167) * bVar167 | (cVar46 >= (char)bVar167) * cVar46;
                  bVar102 = (cVar47 < (char)bVar169) * bVar169 | (cVar47 >= (char)bVar169) * cVar47;
                  bVar103 = (cVar48 < (char)bVar171) * bVar171 | (cVar48 >= (char)bVar171) * cVar48;
                  bVar104 = (cVar49 < (char)bVar173) * bVar173 | (cVar49 >= (char)bVar173) * cVar49;
                  bVar105 = (cVar50 < (char)bVar175) * bVar175 | (cVar50 >= (char)bVar175) * cVar50;
                  bVar106 = (cVar51 < (char)bVar177) * bVar177 | (cVar51 >= (char)bVar177) * cVar51;
                  bVar107 = (cVar52 < (char)bVar179) * bVar179 | (cVar52 >= (char)bVar179) * cVar52;
                  auVar80[0] = ((char)bVar87 < (char)auVar91[0]) * auVar91[0] |
                               ((char)bVar87 >= (char)auVar91[0]) * bVar87;
                  auVar80[1] = ((char)bVar93 < (char)auVar91[1]) * auVar91[1] |
                               ((char)bVar93 >= (char)auVar91[1]) * bVar93;
                  auVar80[2] = ((char)bVar94 < (char)auVar91[2]) * auVar91[2] |
                               ((char)bVar94 >= (char)auVar91[2]) * bVar94;
                  auVar80[3] = ((char)bVar95 < (char)auVar91[3]) * auVar91[3] |
                               ((char)bVar95 >= (char)auVar91[3]) * bVar95;
                  auVar80[4] = ((char)bVar96 < (char)auVar91[4]) * auVar91[4] |
                               ((char)bVar96 >= (char)auVar91[4]) * bVar96;
                  auVar80[5] = ((char)bVar97 < (char)auVar91[5]) * auVar91[5] |
                               ((char)bVar97 >= (char)auVar91[5]) * bVar97;
                  auVar80[6] = ((char)bVar98 < (char)auVar91[6]) * auVar91[6] |
                               ((char)bVar98 >= (char)auVar91[6]) * bVar98;
                  auVar80[7] = ((char)bVar99 < (char)auVar91[7]) * auVar91[7] |
                               ((char)bVar99 >= (char)auVar91[7]) * bVar99;
                  auVar80[8] = ((char)bVar100 < (char)auVar91[8]) * auVar91[8] |
                               ((char)bVar100 >= (char)auVar91[8]) * bVar100;
                  auVar80[9] = ((char)bVar101 < (char)auVar91[9]) * auVar91[9] |
                               ((char)bVar101 >= (char)auVar91[9]) * bVar101;
                  auVar80[10] = ((char)bVar102 < (char)auVar91[10]) * auVar91[10] |
                                ((char)bVar102 >= (char)auVar91[10]) * bVar102;
                  auVar80[0xb] = ((char)bVar103 < (char)auVar91[0xb]) * auVar91[0xb] |
                                 ((char)bVar103 >= (char)auVar91[0xb]) * bVar103;
                  auVar80[0xc] = ((char)bVar104 < (char)auVar91[0xc]) * auVar91[0xc] |
                                 ((char)bVar104 >= (char)auVar91[0xc]) * bVar104;
                  auVar80[0xd] = ((char)bVar105 < (char)auVar91[0xd]) * auVar91[0xd] |
                                 ((char)bVar105 >= (char)auVar91[0xd]) * bVar105;
                  auVar80[0xe] = ((char)bVar106 < (char)auVar91[0xe]) * auVar91[0xe] |
                                 ((char)bVar106 >= (char)auVar91[0xe]) * bVar106;
                  auVar80[0xf] = ((char)bVar107 < (char)auVar91[0xf]) * auVar91[0xf] |
                                 ((char)bVar107 >= (char)auVar91[0xf]) * bVar107;
                  auVar85[0] = -(bVar148 == auVar80[0]);
                  auVar85[1] = -(bVar151 == auVar80[1]);
                  auVar85[2] = -(bVar153 == auVar80[2]);
                  auVar85[3] = -(bVar155 == auVar80[3]);
                  auVar85[4] = -(bVar157 == auVar80[4]);
                  auVar85[5] = -(bVar159 == auVar80[5]);
                  auVar85[6] = -(bVar161 == auVar80[6]);
                  auVar85[7] = -(bVar163 == auVar80[7]);
                  auVar85[8] = -(bVar165 == auVar80[8]);
                  auVar85[9] = -(bVar167 == auVar80[9]);
                  auVar85[10] = -(bVar169 == auVar80[10]);
                  auVar85[0xb] = -(bVar171 == auVar80[0xb]);
                  auVar85[0xc] = -(bVar173 == auVar80[0xc]);
                  auVar85[0xd] = -(bVar175 == auVar80[0xd]);
                  auVar85[0xe] = -(bVar177 == auVar80[0xe]);
                  auVar85[0xf] = -(bVar179 == auVar80[0xf]);
                  auVar92[0] = -((char)auVar91[0] < (char)bVar87);
                  auVar92[1] = -((char)auVar91[1] < (char)bVar93);
                  auVar92[2] = -((char)auVar91[2] < (char)bVar94);
                  auVar92[3] = -((char)auVar91[3] < (char)bVar95);
                  auVar92[4] = -((char)auVar91[4] < (char)bVar96);
                  auVar92[5] = -((char)auVar91[5] < (char)bVar97);
                  auVar92[6] = -((char)auVar91[6] < (char)bVar98);
                  auVar92[7] = -((char)auVar91[7] < (char)bVar99);
                  auVar92[8] = -((char)auVar91[8] < (char)bVar100);
                  auVar92[9] = -((char)auVar91[9] < (char)bVar101);
                  auVar92[10] = -((char)auVar91[10] < (char)bVar102);
                  auVar92[0xb] = -((char)auVar91[0xb] < (char)bVar103);
                  auVar92[0xc] = -((char)auVar91[0xc] < (char)bVar104);
                  auVar92[0xd] = -((char)auVar91[0xd] < (char)bVar105);
                  auVar92[0xe] = -((char)auVar91[0xe] < (char)bVar106);
                  auVar92[0xf] = -((char)auVar91[0xf] < (char)bVar107);
                  auVar110 = pblendvb(auVar181,*(undefined1 (*) [16])((long)*b_00 + lVar26),auVar92)
                  ;
                  auVar110 = pblendvb(auVar110,*(undefined1 (*) [16])((long)*b_03 + lVar26),auVar85)
                  ;
                  auVar112 = paddsb(auVar88,auVar109);
                  auVar88 = pblendvb(auVar184,*(undefined1 (*) [16])((long)*b_01 + lVar26),auVar92);
                  auVar88 = pblendvb(auVar88,*(undefined1 (*) [16])((long)*b_04 + lVar26),auVar85);
                  auVar111 = pblendvb(auVar112,*(undefined1 (*) [16])((long)*b_02 + lVar26),auVar92)
                  ;
                  auVar111 = pblendvb(auVar111,*(undefined1 (*) [16])((long)*b_05 + lVar26),auVar85)
                  ;
                  *(undefined1 (*) [16])((long)*ptr + lVar26) = auVar80;
                  *(undefined1 (*) [16])((long)*b_03 + lVar26) = auVar110;
                  *(undefined1 (*) [16])((long)*b_04 + lVar26) = auVar88;
                  *(undefined1 (*) [16])((long)*b_05 + lVar26) = auVar111;
                  bVar116 = ((char)auVar80[0] < (char)bVar116) * auVar80[0] |
                            ((char)auVar80[0] >= (char)bVar116) * bVar116;
                  bVar118 = ((char)auVar80[1] < (char)bVar118) * auVar80[1] |
                            ((char)auVar80[1] >= (char)bVar118) * bVar118;
                  bVar120 = ((char)auVar80[2] < (char)bVar120) * auVar80[2] |
                            ((char)auVar80[2] >= (char)bVar120) * bVar120;
                  bVar122 = ((char)auVar80[3] < (char)bVar122) * auVar80[3] |
                            ((char)auVar80[3] >= (char)bVar122) * bVar122;
                  bVar124 = ((char)auVar80[4] < (char)bVar124) * auVar80[4] |
                            ((char)auVar80[4] >= (char)bVar124) * bVar124;
                  bVar126 = ((char)auVar80[5] < (char)bVar126) * auVar80[5] |
                            ((char)auVar80[5] >= (char)bVar126) * bVar126;
                  bVar128 = ((char)auVar80[6] < (char)bVar128) * auVar80[6] |
                            ((char)auVar80[6] >= (char)bVar128) * bVar128;
                  bVar130 = ((char)auVar80[7] < (char)bVar130) * auVar80[7] |
                            ((char)auVar80[7] >= (char)bVar130) * bVar130;
                  bVar132 = ((char)auVar80[8] < (char)bVar132) * auVar80[8] |
                            ((char)auVar80[8] >= (char)bVar132) * bVar132;
                  bVar134 = ((char)auVar80[9] < (char)bVar134) * auVar80[9] |
                            ((char)auVar80[9] >= (char)bVar134) * bVar134;
                  bVar136 = ((char)auVar80[10] < (char)bVar136) * auVar80[10] |
                            ((char)auVar80[10] >= (char)bVar136) * bVar136;
                  bVar138 = ((char)auVar80[0xb] < (char)bVar138) * auVar80[0xb] |
                            ((char)auVar80[0xb] >= (char)bVar138) * bVar138;
                  bVar140 = ((char)auVar80[0xc] < (char)bVar140) * auVar80[0xc] |
                            ((char)auVar80[0xc] >= (char)bVar140) * bVar140;
                  bVar142 = ((char)auVar80[0xd] < (char)bVar142) * auVar80[0xd] |
                            ((char)auVar80[0xd] >= (char)bVar142) * bVar142;
                  bVar144 = ((char)auVar80[0xe] < (char)bVar144) * auVar80[0xe] |
                            ((char)auVar80[0xe] >= (char)bVar144) * bVar144;
                  bVar146 = ((char)auVar80[0xf] < (char)bVar146) * auVar80[0xf] |
                            ((char)auVar80[0xf] >= (char)bVar146) * bVar146;
                  cVar32 = auVar83[0];
                  bVar148 = (cVar32 < (char)auVar80[0]) * auVar80[0] |
                            (cVar32 >= (char)auVar80[0]) * cVar32;
                  cVar32 = auVar83[1];
                  bVar151 = (cVar32 < (char)auVar80[1]) * auVar80[1] |
                            (cVar32 >= (char)auVar80[1]) * cVar32;
                  cVar32 = auVar83[2];
                  bVar153 = (cVar32 < (char)auVar80[2]) * auVar80[2] |
                            (cVar32 >= (char)auVar80[2]) * cVar32;
                  cVar32 = auVar83[3];
                  bVar155 = (cVar32 < (char)auVar80[3]) * auVar80[3] |
                            (cVar32 >= (char)auVar80[3]) * cVar32;
                  cVar32 = auVar83[4];
                  bVar157 = (cVar32 < (char)auVar80[4]) * auVar80[4] |
                            (cVar32 >= (char)auVar80[4]) * cVar32;
                  cVar32 = auVar83[5];
                  bVar159 = (cVar32 < (char)auVar80[5]) * auVar80[5] |
                            (cVar32 >= (char)auVar80[5]) * cVar32;
                  cVar32 = auVar83[6];
                  bVar161 = (cVar32 < (char)auVar80[6]) * auVar80[6] |
                            (cVar32 >= (char)auVar80[6]) * cVar32;
                  cVar32 = auVar83[7];
                  bVar163 = (cVar32 < (char)auVar80[7]) * auVar80[7] |
                            (cVar32 >= (char)auVar80[7]) * cVar32;
                  cVar32 = auVar83[8];
                  bVar165 = (cVar32 < (char)auVar80[8]) * auVar80[8] |
                            (cVar32 >= (char)auVar80[8]) * cVar32;
                  cVar32 = auVar83[9];
                  bVar167 = (cVar32 < (char)auVar80[9]) * auVar80[9] |
                            (cVar32 >= (char)auVar80[9]) * cVar32;
                  cVar32 = auVar83[10];
                  bVar169 = (cVar32 < (char)auVar80[10]) * auVar80[10] |
                            (cVar32 >= (char)auVar80[10]) * cVar32;
                  cVar32 = auVar83[0xb];
                  bVar171 = (cVar32 < (char)auVar80[0xb]) * auVar80[0xb] |
                            (cVar32 >= (char)auVar80[0xb]) * cVar32;
                  cVar32 = auVar83[0xc];
                  bVar173 = (cVar32 < (char)auVar80[0xc]) * auVar80[0xc] |
                            (cVar32 >= (char)auVar80[0xc]) * cVar32;
                  cVar32 = auVar83[0xd];
                  bVar175 = (cVar32 < (char)auVar80[0xd]) * auVar80[0xd] |
                            (cVar32 >= (char)auVar80[0xd]) * cVar32;
                  cVar32 = auVar83[0xe];
                  cVar33 = auVar83[0xf];
                  bVar177 = (cVar32 < (char)auVar80[0xe]) * auVar80[0xe] |
                            (cVar32 >= (char)auVar80[0xe]) * cVar32;
                  bVar179 = (cVar33 < (char)auVar80[0xf]) * auVar80[0xf] |
                            (cVar33 >= (char)auVar80[0xf]) * cVar33;
                  cVar32 = auVar110[0];
                  bVar148 = ((char)bVar148 < cVar32) * cVar32 | ((char)bVar148 >= cVar32) * bVar148;
                  cVar32 = auVar110[1];
                  bVar151 = ((char)bVar151 < cVar32) * cVar32 | ((char)bVar151 >= cVar32) * bVar151;
                  cVar32 = auVar110[2];
                  bVar153 = ((char)bVar153 < cVar32) * cVar32 | ((char)bVar153 >= cVar32) * bVar153;
                  cVar32 = auVar110[3];
                  bVar155 = ((char)bVar155 < cVar32) * cVar32 | ((char)bVar155 >= cVar32) * bVar155;
                  cVar32 = auVar110[4];
                  bVar157 = ((char)bVar157 < cVar32) * cVar32 | ((char)bVar157 >= cVar32) * bVar157;
                  cVar32 = auVar110[5];
                  bVar159 = ((char)bVar159 < cVar32) * cVar32 | ((char)bVar159 >= cVar32) * bVar159;
                  cVar32 = auVar110[6];
                  bVar161 = ((char)bVar161 < cVar32) * cVar32 | ((char)bVar161 >= cVar32) * bVar161;
                  cVar32 = auVar110[7];
                  bVar163 = ((char)bVar163 < cVar32) * cVar32 | ((char)bVar163 >= cVar32) * bVar163;
                  cVar32 = auVar110[8];
                  bVar165 = ((char)bVar165 < cVar32) * cVar32 | ((char)bVar165 >= cVar32) * bVar165;
                  cVar32 = auVar110[9];
                  bVar167 = ((char)bVar167 < cVar32) * cVar32 | ((char)bVar167 >= cVar32) * bVar167;
                  cVar32 = auVar110[10];
                  bVar169 = ((char)bVar169 < cVar32) * cVar32 | ((char)bVar169 >= cVar32) * bVar169;
                  cVar32 = auVar110[0xb];
                  bVar171 = ((char)bVar171 < cVar32) * cVar32 | ((char)bVar171 >= cVar32) * bVar171;
                  cVar32 = auVar110[0xc];
                  bVar173 = ((char)bVar173 < cVar32) * cVar32 | ((char)bVar173 >= cVar32) * bVar173;
                  cVar32 = auVar110[0xd];
                  bVar175 = ((char)bVar175 < cVar32) * cVar32 | ((char)bVar175 >= cVar32) * bVar175;
                  cVar32 = auVar110[0xe];
                  bVar177 = ((char)bVar177 < cVar32) * cVar32 | ((char)bVar177 >= cVar32) * bVar177;
                  cVar32 = auVar110[0xf];
                  bVar179 = ((char)bVar179 < cVar32) * cVar32 | ((char)bVar179 >= cVar32) * bVar179;
                  cVar32 = auVar111[0];
                  cVar33 = auVar88[0];
                  bVar87 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[1];
                  cVar33 = auVar88[1];
                  bVar93 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[2];
                  cVar33 = auVar88[2];
                  bVar94 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[3];
                  cVar33 = auVar88[3];
                  bVar95 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[4];
                  cVar33 = auVar88[4];
                  bVar96 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[5];
                  cVar33 = auVar88[5];
                  bVar97 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[6];
                  cVar33 = auVar88[6];
                  bVar98 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[7];
                  cVar33 = auVar88[7];
                  bVar99 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[8];
                  cVar33 = auVar88[8];
                  bVar100 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[9];
                  cVar33 = auVar88[9];
                  bVar101 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[10];
                  cVar33 = auVar88[10];
                  bVar102 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[0xb];
                  cVar33 = auVar88[0xb];
                  bVar103 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[0xc];
                  cVar33 = auVar88[0xc];
                  bVar104 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[0xd];
                  cVar33 = auVar88[0xd];
                  bVar105 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[0xe];
                  cVar33 = auVar88[0xe];
                  cVar39 = auVar88[0xf];
                  bVar106 = (cVar33 < cVar32) * cVar32 | (cVar33 >= cVar32) * cVar33;
                  cVar32 = auVar111[0xf];
                  bVar107 = (cVar39 < cVar32) * cVar32 | (cVar39 >= cVar32) * cVar39;
                  auVar83[0] = ((char)bVar87 < (char)bVar148) * bVar148 |
                               ((char)bVar87 >= (char)bVar148) * bVar87;
                  auVar83[1] = ((char)bVar93 < (char)bVar151) * bVar151 |
                               ((char)bVar93 >= (char)bVar151) * bVar93;
                  auVar83[2] = ((char)bVar94 < (char)bVar153) * bVar153 |
                               ((char)bVar94 >= (char)bVar153) * bVar94;
                  auVar83[3] = ((char)bVar95 < (char)bVar155) * bVar155 |
                               ((char)bVar95 >= (char)bVar155) * bVar95;
                  auVar83[4] = ((char)bVar96 < (char)bVar157) * bVar157 |
                               ((char)bVar96 >= (char)bVar157) * bVar96;
                  auVar83[5] = ((char)bVar97 < (char)bVar159) * bVar159 |
                               ((char)bVar97 >= (char)bVar159) * bVar97;
                  auVar83[6] = ((char)bVar98 < (char)bVar161) * bVar161 |
                               ((char)bVar98 >= (char)bVar161) * bVar98;
                  auVar83[7] = ((char)bVar99 < (char)bVar163) * bVar163 |
                               ((char)bVar99 >= (char)bVar163) * bVar99;
                  auVar83[8] = ((char)bVar100 < (char)bVar165) * bVar165 |
                               ((char)bVar100 >= (char)bVar165) * bVar100;
                  auVar83[9] = ((char)bVar101 < (char)bVar167) * bVar167 |
                               ((char)bVar101 >= (char)bVar167) * bVar101;
                  auVar83[10] = ((char)bVar102 < (char)bVar169) * bVar169 |
                                ((char)bVar102 >= (char)bVar169) * bVar102;
                  auVar83[0xb] = ((char)bVar103 < (char)bVar171) * bVar171 |
                                 ((char)bVar103 >= (char)bVar171) * bVar103;
                  auVar83[0xc] = ((char)bVar104 < (char)bVar173) * bVar173 |
                                 ((char)bVar104 >= (char)bVar173) * bVar104;
                  auVar83[0xd] = ((char)bVar105 < (char)bVar175) * bVar175 |
                                 ((char)bVar105 >= (char)bVar175) * bVar105;
                  auVar83[0xe] = ((char)bVar106 < (char)bVar177) * bVar177 |
                                 ((char)bVar106 >= (char)bVar177) * bVar106;
                  auVar83[0xf] = ((char)bVar107 < (char)bVar179) * bVar179 |
                                 ((char)bVar107 >= (char)bVar179) * bVar107;
                  lVar26 = lVar26 + 0x10;
                } while (lVar19 != lVar26);
                cVar33 = (char)(*palVar20)[0];
                cVar39 = *(char *)((long)*palVar20 + 1);
                cVar40 = *(char *)((long)*palVar20 + 2);
                cVar41 = *(char *)((long)*palVar20 + 3);
                cVar42 = *(char *)((long)*palVar20 + 4);
                cVar43 = *(char *)((long)*palVar20 + 5);
                cVar44 = *(char *)((long)*palVar20 + 6);
                cVar45 = *(char *)((long)*palVar20 + 7);
                cVar46 = (char)(*palVar20)[1];
                cVar47 = *(char *)((long)*palVar20 + 9);
                cVar48 = *(char *)((long)*palVar20 + 10);
                cVar49 = *(char *)((long)*palVar20 + 0xb);
                cVar50 = *(char *)((long)*palVar20 + 0xc);
                cVar51 = *(char *)((long)*palVar20 + 0xd);
                cVar52 = *(char *)((long)*palVar20 + 0xe);
                cVar53 = *(char *)((long)*palVar20 + 0xf);
                local_a8 = auVar74[0];
                cStack_a7 = auVar74[1];
                cStack_a6 = auVar74[2];
                cStack_a5 = auVar74[3];
                cStack_a4 = auVar74[4];
                cStack_a3 = auVar74[5];
                cStack_a2 = auVar74[6];
                cStack_a1 = auVar74[7];
                cStack_a0 = auVar74[8];
                cStack_9f = auVar74[9];
                cStack_9e = auVar74[10];
                cStack_9d = auVar74[0xb];
                cStack_9c = auVar74[0xc];
                cStack_9b = auVar74[0xd];
                cStack_9a = auVar74[0xe];
                cStack_99 = auVar74[0xf];
                auVar38[0] = -(local_a8 < cVar33);
                auVar38[1] = -(cStack_a7 < cVar39);
                auVar38[2] = -(cStack_a6 < cVar40);
                auVar38[3] = -(cStack_a5 < cVar41);
                auVar38[4] = -(cStack_a4 < cVar42);
                auVar38[5] = -(cStack_a3 < cVar43);
                auVar38[6] = -(cStack_a2 < cVar44);
                auVar38[7] = -(cStack_a1 < cVar45);
                auVar38[8] = -(cStack_a0 < cVar46);
                auVar38[9] = -(cStack_9f < cVar47);
                auVar38[10] = -(cStack_9e < cVar48);
                auVar38[0xb] = -(cStack_9d < cVar49);
                auVar38[0xc] = -(cStack_9c < cVar50);
                auVar38[0xd] = -(cStack_9b < cVar51);
                auVar38[0xe] = -(cStack_9a < cVar52);
                auVar38[0xf] = -(cStack_99 < cVar53);
                auVar73 = pblendvb(auVar73,(undefined1  [16])b_03[uVar23],auVar38);
                auVar77 = pblendvb(auVar77,(undefined1  [16])b_04[uVar23],auVar38);
                auVar34 = pblendvb(auVar34,(undefined1  [16])b_05[uVar23],auVar38);
                cVar32 = auVar34[0xf];
                auVar74[0] = (local_a8 < cVar33) * cVar33 | (local_a8 >= cVar33) * local_a8;
                auVar74[1] = (cStack_a7 < cVar39) * cVar39 | (cStack_a7 >= cVar39) * cStack_a7;
                auVar74[2] = (cStack_a6 < cVar40) * cVar40 | (cStack_a6 >= cVar40) * cStack_a6;
                auVar74[3] = (cStack_a5 < cVar41) * cVar41 | (cStack_a5 >= cVar41) * cStack_a5;
                auVar74[4] = (cStack_a4 < cVar42) * cVar42 | (cStack_a4 >= cVar42) * cStack_a4;
                auVar74[5] = (cStack_a3 < cVar43) * cVar43 | (cStack_a3 >= cVar43) * cStack_a3;
                auVar74[6] = (cStack_a2 < cVar44) * cVar44 | (cStack_a2 >= cVar44) * cStack_a2;
                auVar74[7] = (cStack_a1 < cVar45) * cVar45 | (cStack_a1 >= cVar45) * cStack_a1;
                auVar74[8] = (cStack_a0 < cVar46) * cVar46 | (cStack_a0 >= cVar46) * cStack_a0;
                auVar74[9] = (cStack_9f < cVar47) * cVar47 | (cStack_9f >= cVar47) * cStack_9f;
                auVar74[10] = (cStack_9e < cVar48) * cVar48 | (cStack_9e >= cVar48) * cStack_9e;
                auVar74[0xb] = (cStack_9d < cVar49) * cVar49 | (cStack_9d >= cVar49) * cStack_9d;
                auVar74[0xc] = (cStack_9c < cVar50) * cVar50 | (cStack_9c >= cVar50) * cStack_9c;
                auVar74[0xd] = (cStack_9b < cVar51) * cVar51 | (cStack_9b >= cVar51) * cStack_9b;
                auVar74[0xe] = (cStack_9a < cVar52) * cVar52 | (cStack_9a >= cVar52) * cStack_9a;
                auVar74[0xf] = (cStack_99 < cVar53) * cVar53 | (cStack_99 >= cVar53) * cStack_99;
                auVar38 = auVar38 & local_1a8;
                if ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar38 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar38 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar38 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar38 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar38 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar38 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar38 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar38 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar38 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar38 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar38[0xf] < '\0') {
                  local_2b4 = (int)uVar86;
                }
                uVar86 = uVar55;
              } while (uVar55 != uVar27);
              uVar31 = (ulong)bVar10;
              if (s2_end == 0) {
                cVar33 = '\0';
                cVar39 = '\0';
                cVar32 = '\0';
              }
              else {
                if (iVar12 < 0xf) {
                  uVar21 = 1;
                  if (1 < (int)uVar17) {
                    uVar21 = uVar17;
                  }
                  do {
                    lVar19 = auVar74._8_8_;
                    uVar31 = auVar74._0_8_;
                    auVar74._0_8_ = uVar31 << 8;
                    auVar74._8_8_ = lVar19 << 8 | uVar31 >> 0x38;
                    lVar19 = auVar73._8_8_;
                    uVar31 = auVar73._0_8_;
                    auVar73._0_8_ = uVar31 << 8;
                    auVar73._8_8_ = lVar19 << 8 | uVar31 >> 0x38;
                    lVar19 = auVar77._8_8_;
                    uVar31 = auVar77._0_8_;
                    auVar77._0_8_ = uVar31 << 8;
                    auVar77._8_8_ = lVar19 << 8 | uVar31 >> 0x38;
                    auVar70._0_8_ = auVar34._0_8_ << 8;
                    auVar70._8_8_ = auVar34._8_8_ << 8 | auVar34._0_8_ >> 0x38;
                    cVar32 = auVar34[0xe];
                    uVar21 = uVar21 - 1;
                    auVar34 = auVar70;
                  } while (uVar21 != 0);
                }
                uVar31 = auVar74._8_8_ >> 0x38;
                cVar33 = (char)(auVar73._8_8_ >> 0x38);
                cVar39 = (char)(auVar77._8_8_ >> 0x38);
              }
              cVar40 = (char)uVar31;
              iVar25 = iVar22;
              if ((s1_end != 0) && (((ulong)uVar15 + 0xf & 0x7ffffff0) != 0)) {
                uVar27 = 0;
                do {
                  iVar24 = ((uint)uVar27 & 0xf) * uVar30 + ((uint)(uVar27 >> 4) & 0xfffffff);
                  if (iVar24 < (int)uVar15) {
                    bVar10 = *(byte *)((long)*ptr + uVar27);
                    uVar18 = (ulong)bVar10;
                    iVar14 = iVar13;
                    if (((char)(byte)uVar31 < (char)bVar10) ||
                       (((bVar10 == (byte)uVar31 && (local_2b4 == iVar13)) &&
                        (uVar18 = uVar31, iVar14 = local_2b4, iVar24 < iVar25)))) {
                      uVar31 = uVar18;
                      cVar33 = *(char *)((long)*b_03 + uVar27);
                      cVar39 = *(char *)((long)*b_04 + uVar27);
                      cVar32 = *(char *)((long)*b_05 + uVar27);
                      iVar25 = iVar24;
                      local_2b4 = iVar14;
                    }
                  }
                  cVar40 = (char)uVar31;
                  uVar27 = uVar27 + 1;
                } while ((uVar30 & 0x7ffffff) << 4 != (int)uVar27);
              }
              if (s2_end == 0 && s1_end == 0) {
                uVar31 = ptr[uVar23][0];
                uVar27 = ptr[uVar23][1];
                uVar18 = b_03[uVar23][0];
                uVar86 = b_03[uVar23][1];
                auVar77._8_8_ = b_04[uVar23][0];
                auVar73._8_8_ = b_04[uVar23][1];
                auVar74._8_8_ = b_05[uVar23][0];
                uVar55 = b_05[uVar23][1];
                if (iVar12 < 0xf) {
                  uVar15 = 1;
                  if (1 < (int)uVar17) {
                    uVar15 = uVar17;
                  }
                  do {
                    uVar27 = uVar27 << 8 | uVar31 >> 0x38;
                    uVar86 = uVar86 << 8 | uVar18 >> 0x38;
                    auVar73._8_8_ = auVar73._8_8_ << 8 | auVar77._8_8_ >> 0x38;
                    uVar55 = uVar55 << 8 | auVar74._8_8_ >> 0x38;
                    uVar15 = uVar15 - 1;
                    uVar31 = uVar31 << 8;
                    uVar18 = uVar18 << 8;
                    auVar77._8_8_ = auVar77._8_8_ << 8;
                    auVar74._8_8_ = auVar74._8_8_ << 8;
                  } while (uVar15 != 0);
                }
                cVar40 = (char)(uVar27 >> 0x38);
                cVar33 = (char)(uVar86 >> 0x38);
                cVar39 = (char)(auVar73._8_8_ >> 0x38);
                cVar32 = (char)(uVar55 >> 0x38);
                iVar25 = iVar22;
                local_2b4 = iVar13;
              }
              local_1b8 = auVar72[0];
              cStack_1b7 = auVar72[1];
              cStack_1b6 = auVar72[2];
              cStack_1b5 = auVar72[3];
              cStack_1b4 = auVar72[4];
              cStack_1b3 = auVar72[5];
              cStack_1b2 = auVar72[6];
              cStack_1b1 = auVar72[7];
              cStack_1b0 = auVar72[8];
              cStack_1af = auVar72[9];
              cStack_1ae = auVar72[10];
              cStack_1ad = auVar72[0xb];
              cStack_1ac = auVar72[0xc];
              cStack_1ab = auVar72[0xd];
              cStack_1aa = auVar72[0xe];
              cStack_1a9 = auVar72[0xf];
              auVar34[0] = -((char)bVar116 < local_1b8);
              auVar34[1] = -((char)bVar118 < cStack_1b7);
              auVar34[2] = -((char)bVar120 < cStack_1b6);
              auVar34[3] = -((char)bVar122 < cStack_1b5);
              auVar34[4] = -((char)bVar124 < cStack_1b4);
              auVar34[5] = -((char)bVar126 < cStack_1b3);
              auVar34[6] = -((char)bVar128 < cStack_1b2);
              auVar34[7] = -((char)bVar130 < cStack_1b1);
              auVar34[8] = -((char)bVar132 < cStack_1b0);
              auVar34[9] = -((char)bVar134 < cStack_1af);
              auVar34[10] = -((char)bVar136 < cStack_1ae);
              auVar34[0xb] = -((char)bVar138 < cStack_1ad);
              auVar34[0xc] = -((char)bVar140 < cStack_1ac);
              auVar34[0xd] = -((char)bVar142 < cStack_1ab);
              auVar34[0xe] = -((char)bVar144 < cStack_1aa);
              auVar34[0xf] = -((char)bVar146 < cStack_1a9);
              auVar71[0] = -((char)local_e8 < (char)auVar83[0]);
              auVar71[1] = -((char)bStack_e7 < (char)auVar83[1]);
              auVar71[2] = -((char)bStack_e6 < (char)auVar83[2]);
              auVar71[3] = -((char)bStack_e5 < (char)auVar83[3]);
              auVar71[4] = -((char)bStack_e4 < (char)auVar83[4]);
              auVar71[5] = -((char)bStack_e3 < (char)auVar83[5]);
              auVar71[6] = -((char)bStack_e2 < (char)auVar83[6]);
              auVar71[7] = -((char)bStack_e1 < (char)auVar83[7]);
              auVar71[8] = -((char)bStack_e0 < (char)auVar83[8]);
              auVar71[9] = -((char)bStack_df < (char)auVar83[9]);
              auVar71[10] = -((char)bStack_de < (char)auVar83[10]);
              auVar71[0xb] = -((char)bStack_dd < (char)auVar83[0xb]);
              auVar71[0xc] = -((char)bStack_dc < (char)auVar83[0xc]);
              auVar71[0xd] = -((char)bStack_db < (char)auVar83[0xd]);
              auVar71[0xe] = -((char)bStack_da < (char)auVar83[0xe]);
              auVar71[0xf] = -((char)bStack_d9 < (char)auVar83[0xf]);
              auVar71 = auVar71 | auVar34;
              if ((((((((((((((((auVar71 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar71 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar71 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar71 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar71 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar71 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar71 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar71 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar71 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar71 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar71 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar71 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar71[0xf] < '\0') {
                *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                cVar40 = '\0';
                cVar33 = '\0';
                cVar39 = '\0';
                cVar32 = '\0';
                local_2b4 = 0;
                iVar25 = 0;
              }
              ppVar16->score = (int)cVar40;
              ppVar16->end_query = iVar25;
              ppVar16->end_ref = local_2b4;
              *(int *)(ppVar16->field_4).extra = (int)cVar33;
              ((ppVar16->field_4).stats)->similar = (int)cVar39;
              ((ppVar16->field_4).stats)->length = (int)cVar32;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar16;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile8.score;
    pvPm = (__m128i*)profile->profile8.matches;
    pvPs = (__m128i*)profile->profile8.similar;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi8(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi8(segLen), 1);
    vNegInfFront = _mm_insert_epi8(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi8(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi8(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi8(vGapper, vGapE);
            vGapperL = _mm_adds_epi8(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 1);
        vHpM = _mm_slli_si128(vHpM, 1);
        vHpS = _mm_slli_si128(vHpS, 1);
        vHpL = _mm_slli_si128(vHpL, 1);
        vHp = _mm_insert_epi8(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi8(vH, vGapO);
            vE_ext = _mm_subs_epi8(vE, vGapE);
            case1 = _mm_cmpgt_epi8(vE_opn, vE_ext);
            vE = _mm_max_epi8(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi8(vEL, vOne);
            vGapper = _mm_adds_epi8(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi8(vF, vGapper),
                    _mm_cmpeq_epi8(vF, vGapper));
            vF = _mm_max_epi8(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi8(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi8(vHp, vW);
            vHpM = _mm_adds_epi8(vHpM, vWM);
            vHpS = _mm_adds_epi8(vHpS, vWS);
            vHpL = _mm_adds_epi8(vHpL, vOne);
            case1 = _mm_cmpgt_epi8(vE, vHp);
            vHt = _mm_max_epi8(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 1);
        vHtM = _mm_slli_si128(vHtM, 1);
        vHtS = _mm_slli_si128(vHtS, 1);
        vHtL = _mm_slli_si128(vHtL, 1);
        vHt = _mm_insert_epi8(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi8(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi8(vGapper, vF),
                _mm_cmpeq_epi8(vGapper, vF));
        vF = _mm_max_epi8(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi8(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 1);
            __m128i vFtM = _mm_slli_si128(vFM, 1);
            __m128i vFtS = _mm_slli_si128(vFS, 1);
            __m128i vFtL = _mm_slli_si128(vFL, 1);
            vFt = _mm_adds_epi8(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi8(vFt, vF),
                    _mm_cmpeq_epi8(vFt, vF));
            vF = _mm_max_epi8(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi8(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 1);
        vFM = _mm_slli_si128(vFM, 1);
        vFS = _mm_slli_si128(vFS, 1);
        vFL = _mm_slli_si128(vFL, 1);
        vF = _mm_adds_epi8(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi8(vF, vHt);
        vH = _mm_max_epi8(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi8(vH, vGapO);
            vF_ext = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi8(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi8(vFL, vOne);
            vH = _mm_max_epi8(vHp, vE);
            vH = _mm_max_epi8(vH, vF);
            case1 = _mm_cmpeq_epi8(vH, vHp);
            case2 = _mm_cmpeq_epi8(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            cond_max = _mm_cmpgt_epi8(vH, vMaxH);
            vMaxH = _mm_max_epi8(vMaxH, vH);
            vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
                vHM = _mm_slli_si128(vHM, 1);
                vHS = _mm_slli_si128(vHS, 1);
                vHL = _mm_slli_si128(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
            result->stats->rowcols->matches_row[j] = (int8_t) _mm_extract_epi8 (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int8_t) _mm_extract_epi8 (vHS, 15);
            result->stats->rowcols->length_row[j] = (int8_t) _mm_extract_epi8 (vHL, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
            vMaxM = _mm_slli_si128(vMaxM, 1);
            vMaxS = _mm_slli_si128(vMaxS, 1);
            vMaxL = _mm_slli_si128(vMaxL, 1);
        }
        end_query = s1Len-1;
        score = (int8_t) _mm_extract_epi8(vMaxH, 15);
        matches = (int8_t) _mm_extract_epi8(vMaxM, 15);
        similar = (int8_t) _mm_extract_epi8(vMaxS, 15);
        length = (int8_t) _mm_extract_epi8(vMaxL, 15);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvH;
        int8_t *m = (int8_t*)pvHM;
        int8_t *s = (int8_t*)pvHS;
        int8_t *l = (int8_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 1);
            vHM = _mm_slli_si128(vHM, 1);
            vHS = _mm_slli_si128(vHS, 1);
            vHL = _mm_slli_si128(vHL, 1);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int8_t) _mm_extract_epi8 (vH, 15);
        matches = (int8_t) _mm_extract_epi8 (vHM, 15);
        similar = (int8_t) _mm_extract_epi8 (vHS, 15);
        length = (int8_t) _mm_extract_epi8 (vHL, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}